

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RectMatrix.hpp
# Opt level: O1

ostream * OpenMD::operator<<(ostream *o,RectMatrix<double,_3U,_3U> *m)

{
  uint i;
  long lVar1;
  uint j;
  long lVar2;
  
  lVar1 = 0;
  do {
    std::__ostream_insert<char,std::char_traits<char>>(o,"(",1);
    lVar2 = 0;
    do {
      std::ostream::_M_insert<double>((*(double (*) [3])*(double (*) [3])m)[lVar2]);
      if (lVar2 != 2) {
        std::__ostream_insert<char,std::char_traits<char>>(o,"\t",1);
      }
      lVar2 = lVar2 + 1;
    } while (lVar2 != 3);
    std::__ostream_insert<char,std::char_traits<char>>(o,")",1);
    std::ios::widen((char)*(undefined8 *)(*(long *)o + -0x18) + (char)o);
    std::ostream::put((char)o);
    std::ostream::flush();
    lVar1 = lVar1 + 1;
    m = (RectMatrix<double,_3U,_3U> *)((long)m + 0x18);
  } while (lVar1 != 3);
  return o;
}

Assistant:

std::ostream& operator<<(std::ostream& o,
                           const RectMatrix<Real, Row, Col>& m) {
    for (unsigned int i = 0; i < Row; i++) {
      o << "(";
      for (unsigned int j = 0; j < Col; j++) {
        o << m(i, j);
        if (j != Col - 1) o << "\t";
      }
      o << ")" << std::endl;
    }
    return o;
  }